

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

bool create_drawonable(Am_Object *window)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Am_Drawonable *pAVar7;
  Am_Window_ToDo *pAVar8;
  undefined4 extraout_var;
  char *local_398;
  uint local_390;
  uint local_388;
  anon_union_8_8_ea4c8939_for_value *local_380;
  uint local_378;
  int local_370;
  int local_368;
  int local_360;
  int local_358;
  uint local_350;
  uint local_348;
  uint local_340;
  undefined4 local_338;
  Am_Input_Event_Handlers *local_330;
  Am_Drawonable *local_320;
  undefined1 local_311;
  Am_Value *local_310;
  Am_Drawonable *local_308;
  Am_Wrapper *local_300;
  undefined1 *local_2f8;
  Am_Drawonable *local_2f0;
  byte local_2e2;
  byte local_2e1;
  char *local_2e0;
  Am_Drawonable *local_2d8;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  char *local_2c0;
  byte local_2b2;
  undefined1 local_2b1;
  Am_Value *local_2b0;
  undefined1 local_2a1;
  Am_Value *local_2a0;
  undefined1 local_291;
  Am_Value *local_290;
  int local_284;
  Am_Value *local_280;
  undefined1 local_271;
  Am_Value *local_270;
  int local_264;
  Am_Value *local_260;
  undefined1 local_251;
  Am_Value *local_250;
  int local_244;
  Am_Value *local_240;
  undefined1 local_231;
  Am_Value *local_230;
  int local_224;
  Am_Value *local_220;
  undefined1 local_211;
  Am_Value *local_210;
  undefined1 local_201;
  Am_Value *local_200;
  Am_Value *local_1f8;
  undefined1 local_1e9;
  Am_Value *local_1e8;
  undefined1 local_1d9;
  Am_Value *local_1d8;
  Am_Value *local_1d0;
  uint local_1c4;
  Am_Value *local_1c0;
  uint local_1b4;
  Am_Value *local_1b0;
  uint local_1a4;
  Am_Value *local_1a0;
  uint local_194;
  Am_Value *local_190;
  Am_Ptr local_188;
  Am_Value *local_180;
  Am_Ptr local_178;
  Am_Value *local_170;
  Am_Ptr local_168;
  Am_Value *local_160;
  Am_Wrapper *local_158;
  Am_Value *local_150;
  byte local_144;
  undefined1 local_143;
  byte local_142;
  undefined1 local_141;
  Am_Object *local_140;
  Am_Object *local_138;
  Am_Wrapper *local_130;
  Am_Object local_128;
  Am_Am_Drawonable local_120;
  Am_Value local_118;
  Am_Cursor local_108;
  undefined1 local_100 [8];
  Am_Value v;
  Am_Drawonable *drawonable;
  byte local_d7;
  byte local_d6;
  byte local_d5;
  int local_d4;
  bool omit_title_bar;
  bool query_size;
  int iStack_d0;
  bool query_pos;
  int max_height;
  int max_width;
  int min_height;
  int min_width;
  bool save_under;
  Am_Style back_fill;
  bool iconified;
  bool visible;
  Am_String local_a8;
  Am_String icon_title;
  Am_String title;
  int height;
  int width;
  int top;
  int left;
  Am_Window_ToDo *my_todo;
  Am_Window_ToDo *owner_todo;
  Am_Drawonable *parent;
  Am_Object local_68;
  Am_Object local_60;
  undefined4 local_58;
  Am_Object local_48;
  Am_Object owner;
  Am_Object *window_local;
  
  local_138 = &local_48;
  local_140 = window;
  owner.data = (Am_Object_Data *)window;
  Am_Object::Get_Owner(local_138,(Am_Slot_Flags)window);
  local_130 = Am_Object::operator_cast_to_Am_Wrapper_(local_138);
  if (local_130 == (Am_Wrapper *)0x0) {
    window_local._7_1_ = false;
    local_58 = 1;
  }
  else {
    Am_Object::Am_Object(&local_60,&Am_Screen);
    local_141 = Am_Object::Is_Instance_Of(&local_48,&local_60);
    local_142 = 0;
    bVar1 = !(bool)local_141;
    if (bVar1) {
      Am_Object::Am_Object(&local_68,&Am_Window);
      local_143 = Am_Object::Is_Instance_Of(&local_48,&local_68);
      local_142 = local_143 ^ 0xff;
    }
    local_144 = local_142;
    if (bVar1) {
      Am_Object::~Am_Object(&local_68);
    }
    Am_Object::~Am_Object(&local_60);
    if ((local_144 & 1) != 0) {
      local_150 = Am_Object::Get(&local_48,0x68,0);
      Am_Object::operator=(&local_48,local_150);
      local_158 = Am_Object::operator_cast_to_Am_Wrapper_(&local_48);
      if (local_158 == (Am_Wrapper *)0x0) {
        window_local._7_1_ = false;
        local_58 = 1;
        goto LAB_00295063;
      }
    }
    local_160 = Am_Object::Get(&local_48,0x7d2,0);
    local_168 = Am_Value::operator_cast_to_void_(local_160);
    pAVar7 = Am_Drawonable::Narrow(local_168);
    if (pAVar7 == (Am_Drawonable *)0x0) {
      local_170 = Am_Object::Get(&local_48,0x7d6,0);
      local_178 = Am_Value::operator_cast_to_void_(local_170);
      pAVar8 = Am_Window_ToDo::Narrow(local_178);
      if (pAVar8->flags != 0) {
        local_180 = Am_Object::Get(local_140,0x7d6,0);
        local_188 = Am_Value::operator_cast_to_void_(local_180);
        pAVar8 = Am_Window_ToDo::Narrow(local_188);
        Am_Window_ToDo::Add(pAVar8);
      }
      window_local._7_1_ = false;
      local_58 = 1;
    }
    else {
      local_190 = Am_Object::Get(local_140,100,0);
      uVar2 = Am_Value::operator_cast_to_int(local_190);
      local_194 = uVar2;
      local_1a0 = Am_Object::Get(local_140,0x65,0);
      uVar3 = Am_Value::operator_cast_to_int(local_1a0);
      local_1a4 = uVar3;
      local_1b0 = Am_Object::Get(local_140,0x66,0);
      uVar4 = Am_Value::operator_cast_to_int(local_1b0);
      local_1b4 = uVar4;
      local_1c0 = Am_Object::Get(local_140,0x67,0);
      uVar5 = Am_Value::operator_cast_to_int(local_1c0);
      local_1c4 = uVar5;
      Am_String::Am_String(&icon_title);
      Am_String::Am_String(&local_a8);
      local_1d0 = Am_Object::Get(local_140,0x6c,0);
      Am_String::operator=(&icon_title,local_1d0);
      get_icon_title((Am_Object *)&stack0xffffffffffffff50);
      Am_String::operator=(&local_a8,(Am_String *)&stack0xffffffffffffff50);
      Am_String::~Am_String((Am_String *)&stack0xffffffffffffff50);
      local_1d8 = Am_Object::Get(local_140,0x69,0);
      local_1d9 = Am_Value::operator_cast_to_bool(local_1d8);
      back_fill.data._7_1_ = local_1d9;
      local_1e8 = Am_Object::Get(local_140,0x76,0);
      local_1e9 = Am_Value::operator_cast_to_bool(local_1e8);
      back_fill.data._6_1_ = local_1e9;
      Am_Style::Am_Style((Am_Style *)&min_width);
      local_1f8 = Am_Object::Get(local_140,0x6a,0);
      Am_Style::operator=((Am_Style *)&min_width,local_1f8);
      local_200 = Am_Object::Get(local_140,0x7f,0);
      local_201 = Am_Value::operator_cast_to_bool(local_200);
      min_height._3_1_ = local_201;
      local_210 = Am_Object::Get(local_140,0x74,0);
      local_211 = Am_Value::operator_cast_to_bool(local_210);
      if ((bool)local_211) {
        local_220 = Am_Object::Get(local_140,0x70,0);
        local_224 = Am_Value::operator_cast_to_int(local_220);
        max_width = local_224;
      }
      else {
        max_width = 1;
      }
      local_230 = Am_Object::Get(local_140,0x75,0);
      local_231 = Am_Value::operator_cast_to_bool(local_230);
      if ((bool)local_231) {
        local_240 = Am_Object::Get(local_140,0x71,0);
        local_244 = Am_Value::operator_cast_to_int(local_240);
        max_height = local_244;
      }
      else {
        max_height = 1;
      }
      local_250 = Am_Object::Get(local_140,0x72,0);
      local_251 = Am_Value::operator_cast_to_bool(local_250);
      if ((bool)local_251) {
        local_260 = Am_Object::Get(local_140,0x6e,0);
        local_264 = Am_Value::operator_cast_to_int(local_260);
        iStack_d0 = local_264;
      }
      else {
        iStack_d0 = 0;
      }
      local_270 = Am_Object::Get(local_140,0x73,0);
      local_271 = Am_Value::operator_cast_to_bool(local_270);
      if ((bool)local_271) {
        local_280 = Am_Object::Get(local_140,0x6f,0);
        local_284 = Am_Value::operator_cast_to_int(local_280);
        local_d4 = local_284;
      }
      else {
        local_d4 = 0;
      }
      local_290 = Am_Object::Get(local_140,0x77,0);
      local_291 = Am_Value::operator_cast_to_bool(local_290);
      local_d5 = local_291;
      local_2a0 = Am_Object::Get(local_140,0x78,0);
      local_2a1 = Am_Value::operator_cast_to_bool(local_2a0);
      local_d6 = local_2a1;
      local_2b0 = Am_Object::Get(local_140,0x79,0);
      local_2b1 = Am_Value::operator_cast_to_bool(local_2b0);
      local_d7 = local_2b1;
      Am_Object::Am_Object((Am_Object *)&drawonable,&Am_Window);
      local_2b2 = Am_Object::Is_Instance_Of(&local_48,(Am_Object *)&drawonable);
      Am_Object::~Am_Object((Am_Object *)&drawonable);
      if ((local_2b2 & 1) != 0) {
        local_d7 = 1;
      }
      local_2d8 = pAVar7;
      local_2d0 = uVar2;
      local_2cc = uVar3;
      local_2c8 = uVar4;
      local_2c4 = uVar5;
      local_2c0 = Am_String::operator_cast_to_char_(&icon_title);
      local_2e0 = Am_String::operator_cast_to_char_(&local_a8);
      local_2e2 = back_fill.data._7_1_;
      local_2e1 = back_fill.data._6_1_;
      Am_Style::Am_Style((Am_Style *)&v.value,(Am_Style *)&min_width);
      local_330 = Am_Global_Opal_Handlers;
      local_340 = local_d6 & 1;
      local_348 = local_d5 & 1;
      local_350 = (byte)~local_d7 & 1;
      local_358 = local_d4;
      local_360 = iStack_d0;
      local_368 = max_height;
      local_370 = max_width;
      local_378 = min_height._3_1_ & 1;
      local_380 = &v.value;
      local_388 = local_2e1 & 1;
      local_390 = local_2e2 & 1;
      local_398 = local_2e0;
      local_338 = 0;
      local_2f8 = (undefined1 *)&local_398;
      iVar6 = (**local_2d8->_vptr_Am_Drawonable)
                        (local_2d8,(ulong)local_2d0,(ulong)local_2cc,(ulong)local_2c8,
                         (ulong)local_2c4,local_2c0);
      local_2f0 = (Am_Drawonable *)CONCAT44(extraout_var,iVar6);
      Am_Style::~Am_Style((Am_Style *)&v.value);
      pAVar7 = local_2f0;
      local_308 = local_2f0;
      local_300 = Am_Object::operator_cast_to_Am_Wrapper_(local_140);
      Am_Drawonable::Set_Data_Store(local_308,local_300);
      local_310 = Am_Object::Get(local_140,0x7e,0);
      Am_Value::Am_Value((Am_Value *)local_100,local_310);
      local_311 = Am_Value::Valid((Am_Value *)local_100);
      if ((bool)local_311) {
        local_320 = pAVar7;
        Am_Cursor::Am_Cursor(&local_108,(Am_Value *)local_100);
        (*local_320->_vptr_Am_Drawonable[0x38])(local_320,&local_108);
        Am_Cursor::~Am_Cursor(&local_108);
      }
      Am_Am_Drawonable::Am_Am_Drawonable(&local_120,pAVar7);
      Am_Am_Drawonable::operator_cast_to_Am_Value((Am_Am_Drawonable *)&local_118);
      Am_Object::Set(local_140,0x7d2,&local_118,0);
      Am_Value::~Am_Value(&local_118);
      Am_Object::Am_Object(&local_128,local_140);
      set_event_mask(&local_128,pAVar7);
      Am_Object::~Am_Object(&local_128);
      window_local._7_1_ = true;
      local_58 = 1;
      Am_Value::~Am_Value((Am_Value *)local_100);
      Am_Style::~Am_Style((Am_Style *)&min_width);
      Am_String::~Am_String(&local_a8);
      Am_String::~Am_String(&icon_title);
    }
  }
LAB_00295063:
  Am_Object::~Am_Object(&local_48);
  return window_local._7_1_;
}

Assistant:

static bool
create_drawonable(Am_Object window)
{
  Am_Object owner = window.Get_Owner();
  if (!owner)
    return false;
  if (!owner.Is_Instance_Of(Am_Screen) && !owner.Is_Instance_Of(Am_Window)) {
    owner = owner.Get(Am_WINDOW);
    if (!owner)
      return false;
  }
  Am_Drawonable *parent = Am_Drawonable::Narrow(owner.Get(Am_DRAWONABLE));
  if (!parent) {
    Am_Window_ToDo *owner_todo = Am_Window_ToDo::Narrow(owner.Get(Am_TODO));
    if (owner_todo->flags) {
      Am_Window_ToDo *my_todo = Am_Window_ToDo::Narrow(window.Get(Am_TODO));
      my_todo->Add();
    }
    return false;
  }
  int left = window.Get(Am_LEFT);
  int top = window.Get(Am_TOP);
  int width = window.Get(Am_WIDTH);
  int height = window.Get(Am_HEIGHT);
  Am_String title, icon_title;
  title = window.Get(Am_TITLE);
  icon_title = get_icon_title(window);
  bool visible = window.Get(Am_VISIBLE);
  bool iconified = window.Get(Am_ICONIFIED);
  Am_Style back_fill;
  back_fill = window.Get(Am_FILL_STYLE);
  bool save_under = window.Get(Am_SAVE_UNDER);
  int min_width;
  if ((bool)window.Get(Am_USE_MIN_WIDTH))
    min_width = window.Get(Am_MIN_WIDTH);
  else
    min_width = 1;
  int min_height;
  if ((bool)window.Get(Am_USE_MIN_HEIGHT))
    min_height = window.Get(Am_MIN_HEIGHT);
  else
    min_height = 1;
  int max_width;
  if ((bool)window.Get(Am_USE_MAX_WIDTH))
    max_width = window.Get(Am_MAX_WIDTH);
  else
    max_width = 0;
  int max_height;
  if ((bool)window.Get(Am_USE_MAX_HEIGHT))
    max_height = window.Get(Am_MAX_HEIGHT);
  else
    max_height = 0;
  bool query_pos = window.Get(Am_QUERY_POSITION);
  bool query_size = window.Get(Am_QUERY_SIZE);
  bool omit_title_bar = window.Get(Am_OMIT_TITLE_BAR);
  if (owner.Is_Instance_Of(Am_Window))
    omit_title_bar = true;

  Am_Drawonable *drawonable = parent->Create(
      left, top, width, height, title, icon_title, visible, iconified,
      back_fill, save_under, min_width, min_height, max_width, max_height,
      !omit_title_bar, query_pos, query_size, false, Am_Global_Opal_Handlers);
  drawonable->Set_Data_Store((Am_Wrapper *)window);
  Am_Value v = window.Get(Am_CURSOR);
  if (v.Valid())
    drawonable->Set_Cursor((Am_Cursor)v);

  window.Set(Am_DRAWONABLE, (Am_Am_Drawonable)drawonable);
  set_event_mask(window, drawonable);
  return true;
}